

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patch_fix_item_checks.hpp
# Opt level: O0

void PatchFixItemChecks::fix_dog_talking_check(ROM *rom)

{
  uint32_t address;
  initializer_list<unsigned_int> __l;
  bool bVar1;
  uint16_t word;
  uint16_t uVar2;
  reference puVar3;
  uint16_t local_104;
  undefined1 local_100 [4];
  uint32_t offset;
  Code cutscene;
  uint32_t dialogue_with_whistle_offset;
  uint32_t dialogue_without_whistle_offset;
  uint32_t addr;
  iterator __end1;
  iterator __begin1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__range1;
  allocator<unsigned_int> local_49;
  uint local_48 [4];
  iterator local_38;
  size_type local_30;
  undefined1 local_28 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> dog_cutscenes;
  ROM *rom_local;
  
  dog_cutscenes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)rom;
  md::ROM::set_word(rom,0x253c0,0x281);
  local_48[0] = 0x26238;
  local_48[1] = 0x2647e;
  local_48[2] = 0x26a40;
  local_48[3] = 0x272b4;
  local_38 = local_48;
  local_30 = 4;
  std::allocator<unsigned_int>::allocator(&local_49);
  __l._M_len = local_30;
  __l._M_array = local_38;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_28,__l,&local_49);
  std::allocator<unsigned_int>::~allocator(&local_49);
  __end1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                     ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_28);
  _dialogue_without_whistle_offset =
       std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                 ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_28);
  while( true ) {
    bVar1 = __gnu_cxx::
            operator==<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                      (&__end1,(__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                                *)&dialogue_without_whistle_offset);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    puVar3 = __gnu_cxx::
             __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
             ::operator*(&__end1);
    address = *puVar3;
    word = md::ROM::get_word((ROM *)dog_cutscenes.
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage,address + 6);
    uVar2 = md::ROM::get_word((ROM *)dog_cutscenes.
                                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage,address + 10
                             );
    cutscene._labels._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ = (uint)uVar2;
    md::Code::Code((Code *)local_100);
    local_104 = 0x5d94 - (short)address;
    md::Code::add_word((Code *)local_100,0x6100);
    md::Code::add_word((Code *)local_100,local_104);
    md::Code::add_word((Code *)local_100,0x281);
    md::Code::add_word((Code *)local_100,
                       cutscene._labels._M_t._M_impl.super__Rb_tree_header._M_node_count._4_2_);
    md::Code::add_word((Code *)local_100,word);
    md::Code::rts((Code *)local_100);
    md::ROM::set_code((ROM *)dog_cutscenes.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_end_of_storage,address,(Code *)local_100);
    md::Code::~Code((Code *)local_100);
    __gnu_cxx::
    __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::
    operator++(&__end1);
  }
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_28);
  return;
}

Assistant:

static void fix_dog_talking_check(md::ROM& rom)
    {
        // Massan dog
        // 0x0253C0:
        // Before:	01 24 (0124 >> 3 = 24 and 0124 & 7 = 04 -----> bit 4 of FF1024)
        // After:	02 81 (0281 >> 3 = 50 and 0281 & 7 = 01 -----> bit 1 of FF1050)
        rom.set_word(0x0253C0, 0x0281);

        // Other dogs
        std::vector<uint32_t> dog_cutscenes = { 0x26238, 0x2647E, 0x26A40, 0x272B4 };
        for(uint32_t addr : dog_cutscenes)
        {
            uint32_t dialogue_without_whistle_offset = rom.get_word(addr + 6);
            uint32_t dialogue_with_whistle_offset = rom.get_word(addr + 10);

            md::Code cutscene;
            {
                uint32_t offset = 0x25D96 - (addr + 2); // 0x25D96 = CheckFlagAndDisplayMessage
                cutscene.add_word(0x6100);
                cutscene.add_word((uint16_t) offset);

                cutscene.add_word(0x0281); // 0281 (0281 >> 3 = 50 and 0281 & 7 = 01 -----> bit 1 of FF1050)

                cutscene.add_word(dialogue_with_whistle_offset);
                cutscene.add_word(dialogue_without_whistle_offset);

                cutscene.rts();
            }

            rom.set_code(addr, cutscene);
        }
    }